

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-shm-client.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  void *pvVar2;
  void *ptr;
  int shm_fd;
  int i;
  int SIZE;
  char *shm_name;
  char **argv_local;
  int argc_local;
  
  iVar1 = shm_open("/AOS",0,0x1b6);
  if (iVar1 == 1) {
    printf("Shared memory segment failed\n");
    exit(1);
  }
  pvVar2 = mmap((void *)0x0,0x1000,1,1,iVar1,0);
  if (pvVar2 == (void *)0xffffffffffffffff) {
    printf("Map failed\n");
    argv_local._4_4_ = 1;
  }
  else {
    printf("%s \n ",pvVar2);
    iVar1 = shm_unlink("/AOS");
    if (iVar1 == 1) {
      printf("Error removing %s\n","/AOS");
      exit(1);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char *argv[]) 
{
    const char * shm_name  = "/AOS";
    const int SIZE = 4096;
    int i, shm_fd;
    void * ptr;
    
    // ******** shm_open() ***************////// 
    //   shm_open()- opening/creation of a shared memory segment referenced by a name
    //        1) A special file will appear in the file-system under “/dev/shm/” with the provided name.
    //        2) The special file represents a POSIX object and it is created for persistence 
    //        3) ftruncate(...) function resize to memory region to the correct size
    
    shm_fd = shm_open(shm_name, O_RDONLY, 0666);
    
    if (shm_fd==1) 
    {
        printf("Shared memory segment failed\n");
        exit(1);
    }
    
    
    // ******** mmap() ***************////// 
    // ******** mmap() – mapping of the memory segment referenced by the file descriptor returned by shm_open() ***************////// 
    
    ptr = mmap(0, SIZE, PROT_READ, MAP_SHARED, shm_fd, 0);
    
    if (ptr == MAP_FAILED) 
    {
        printf("Map failed\n");
        return 1;
        
    }
    /* Read into the memory segment */
    printf("%s \n ", (char *) ptr);
    
    //  shm_unlink()
    //  shm_unlink() – removal of shared memory segment object if nobody is referencing it
    
    if (shm_unlink(shm_name) ==1) 
    {
       printf("Error removing %s\n", shm_name);
       exit(1);
       
    }

    return 0;
}